

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<double>(double *x,size_t n,MissingAction missing_action,double *xmin,double *xmax,
                      bool *unsplittable)

{
  double dVar1;
  bool bVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  if (missing_action == Fail) {
    if (n == 0) goto LAB_0015d483;
    dVar4 = *xmax;
    dVar5 = *xmin;
    sVar3 = 0;
    do {
      dVar1 = x[sVar3];
      dVar6 = dVar1;
      if (dVar5 <= dVar1) {
        dVar6 = dVar5;
      }
      dVar5 = dVar6;
      if (dVar1 <= dVar4) {
        dVar1 = dVar4;
      }
      dVar4 = dVar1;
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  else {
    if (n == 0) goto LAB_0015d483;
    dVar4 = *xmax;
    dVar5 = *xmin;
    sVar3 = 0;
    do {
      dVar1 = x[sVar3];
      dVar6 = dVar1;
      if (dVar5 <= dVar1) {
        dVar6 = dVar5;
      }
      dVar5 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar6 | -(ulong)NAN(dVar5) & (ulong)dVar1);
      dVar6 = dVar1;
      if (dVar1 <= dVar4) {
        dVar6 = dVar4;
      }
      dVar4 = (double)(~-(ulong)NAN(dVar4) & (ulong)dVar6 | -(ulong)NAN(dVar4) & (ulong)dVar1);
      sVar3 = sVar3 + 1;
    } while (n != sVar3);
  }
  *xmin = dVar5;
  *xmax = dVar4;
LAB_0015d483:
  dVar4 = *xmin;
  dVar5 = *xmax;
  bVar2 = true;
  if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (dVar5 != -INFINITY || dVar4 != INFINITY))
  {
    bVar2 = NAN(dVar5);
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(real_t *restrict x, size_t n,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = (x[row] < xmin)? x[row] : xmin;
            xmax = (x[row] > xmax)? x[row] : xmax;
        }
    }


    else
    {
        for (size_t row = 0; row < n; row++)
        {
            xmin = std::fmin(xmin, x[row]);
            xmax = std::fmax(xmax, x[row]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}